

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

ConstantValue * __thiscall slang::ast::IntegralType::getDefaultValueImpl(IntegralType *this)

{
  bool bVar1;
  long in_RSI;
  Type *in_RDI;
  SVInt *in_stack_ffffffffffffff98;
  SVInt *integer;
  ConstantValue *in_stack_ffffffffffffffa0;
  ConstantValue *this_00;
  Type *this_01;
  SVInt local_40 [2];
  
  this_01 = in_RDI;
  bVar1 = Type::isEnum((Type *)0x4881ea);
  if (bVar1) {
    Symbol::as<slang::ast::EnumType>((Symbol *)0x4881fa);
    Type::getDefaultValue(in_RDI);
  }
  else if ((*(byte *)(in_RSI + 0x4d) & 1) == 0) {
    integer = local_40;
    SVInt::SVInt((SVInt *)this_01,(bitwidth_t)((ulong)in_RDI >> 0x20),
                 (uint64_t)in_stack_ffffffffffffffa0,SUB81((ulong)integer >> 0x38,0));
    slang::ConstantValue::ConstantValue(in_stack_ffffffffffffffa0,integer);
    SVInt::~SVInt((SVInt *)this_01);
  }
  else {
    this_00 = (ConstantValue *)&stack0xffffffffffffffe0;
    SVInt::createFillX((bitwidth_t)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
    slang::ConstantValue::ConstantValue(this_00,in_stack_ffffffffffffff98);
    SVInt::~SVInt((SVInt *)this_01);
  }
  return (ConstantValue *)this_01;
}

Assistant:

ConstantValue IntegralType::getDefaultValueImpl() const {
    if (isEnum())
        return as<EnumType>().baseType.getDefaultValue();

    if (isFourState)
        return SVInt::createFillX(bitWidth, isSigned);
    else
        return SVInt(bitWidth, 0, isSigned);
}